

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O1

void __thiscall PDA::Transducer::Generator::writeFunctions(Generator *this,wostream *stream)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  long *plVar2;
  _Alloc_hider _Var3;
  uint uVar4;
  vector<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_> *pvVar5;
  wostream *pwVar6;
  pointer pIVar7;
  wchar_t suff;
  size_t in_RCX;
  ulong uVar8;
  wchar_t in_R8D;
  pointer this_00;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar9;
  long lVar10;
  wstring local_88;
  wstring local_68;
  Register local_48;
  Generator *local_38;
  
  pvVar5 = Tokenizer::identifiers(this->m_tokenizer);
  this_00 = (pvVar5->
            super__Vector_base<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_38 = this;
  pvVar5 = Tokenizer::identifiers(this->m_tokenizer);
  if (this_00 !=
      (pvVar5->
      super__Vector_base<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>)
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      paVar9 = &local_88.field_2;
      if (this_00->type == Function) {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::wstring::_M_construct<wchar_t_const*>
                  ((wstring *)&local_68,L"Function begin",L"");
        comment(&local_88,&local_68);
        pwVar6 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                           (stream,local_88._M_dataplus._M_p,local_88._M_string_length);
        plVar2 = *(long **)(pwVar6 + *(long *)(*(long *)pwVar6 + -0x18) + 0xf0);
        if (plVar2 == (long *)0x0) {
          std::__throw_bad_cast();
        }
        (**(code **)(*plVar2 + 0x50))(plVar2,10);
        std::wostream::put((wchar_t)pwVar6);
        std::wostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_88._M_dataplus._M_p != paVar9) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity * 4 + 4);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity * 4 + 4);
        }
        Utils::Misc::toBase64_abi_cxx11_
                  (&local_88,(Misc *)(this_00->decoratedName)._M_dataplus._M_p,
                   (uchar *)((this_00->decoratedName)._M_string_length << 2),in_RCX);
        suff = (wchar_t)in_RCX;
        pwVar6 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                           (stream,local_88._M_dataplus._M_p,local_88._M_string_length);
        local_68._M_dataplus._M_p._0_4_ = 0x3a;
        pwVar6 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                           (pwVar6,(wchar_t *)&local_68,1);
        plVar2 = *(long **)(pwVar6 + *(long *)(*(long *)pwVar6 + -0x18) + 0xf0);
        if (plVar2 == (long *)0x0) {
          std::__throw_bad_cast();
        }
        (**(code **)(*plVar2 + 0x50))(plVar2,10);
        std::wostream::put((wchar_t)pwVar6);
        std::wostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_88._M_dataplus._M_p != paVar9) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity * 4 + 4);
        }
        local_68._M_dataplus._M_p._0_1_ = 1;
        local_68._M_dataplus._M_p = local_68._M_dataplus._M_p & 0xffffffff;
        local_68._M_string_length._0_2_ = 0x51;
        local_68._M_string_length._2_1_ = 0;
        local_68._M_string_length._4_4_ = 0;
        push_abi_cxx11_(&local_88,(Generator *)&local_68,(Register *)0x0,suff);
        pwVar6 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                           (stream,local_88._M_dataplus._M_p,local_88._M_string_length);
        plVar2 = *(long **)(pwVar6 + *(long *)(*(long *)pwVar6 + -0x18) + 0xf0);
        if (plVar2 == (long *)0x0) {
          std::__throw_bad_cast();
        }
        (**(code **)(*plVar2 + 0x50))(plVar2,10);
        std::wostream::put((wchar_t)pwVar6);
        std::wostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_88._M_dataplus._M_p != paVar9) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity * 4 + 4);
        }
        local_68._M_dataplus._M_p._0_1_ = 1;
        local_68._M_dataplus._M_p = local_68._M_dataplus._M_p & 0xffffffff;
        local_68._M_string_length._0_2_ = 0x52;
        local_68._M_string_length._2_1_ = 0;
        local_68._M_string_length._4_4_ = 0;
        local_48.integer = true;
        local_48.size = Full;
        local_48.argumentIndex = 0x51;
        local_48.isPtr = false;
        local_48.ptrOffset = 0;
        mov_abi_cxx11_(&local_88,(Generator *)&local_68,&local_48,(Register *)0x0,in_R8D);
        pwVar6 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                           (stream,local_88._M_dataplus._M_p,local_88._M_string_length);
        plVar2 = *(long **)(pwVar6 + *(long *)(*(long *)pwVar6 + -0x18) + 0xf0);
        if (plVar2 == (long *)0x0) {
          std::__throw_bad_cast();
        }
        (**(code **)(*plVar2 + 0x50))(plVar2,10);
        std::wostream::put((wchar_t)pwVar6);
        std::wostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_88._M_dataplus._M_p != paVar9) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity * 4 + 4);
        }
        if (0 < this_00->rbpOffset) {
          paVar9 = &local_68.field_2;
          local_68._M_dataplus._M_p = (pointer)paVar9;
          std::__cxx11::wstring::_M_construct<wchar_t_const*>
                    ((wstring *)&local_68,L"Space allocate for variables",L"");
          comment(&local_88,&local_68);
          paVar1 = &local_88.field_2;
          pwVar6 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                             (stream,local_88._M_dataplus._M_p,local_88._M_string_length);
          plVar2 = *(long **)(pwVar6 + *(long *)(*(long *)pwVar6 + -0x18) + 0xf0);
          if (plVar2 == (long *)0x0) {
            std::__throw_bad_cast();
          }
          (**(code **)(*plVar2 + 0x50))(plVar2,10);
          std::wostream::put((wchar_t)pwVar6);
          std::wostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_88._M_dataplus._M_p != paVar1) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity * 4 + 4
                           );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_68._M_dataplus._M_p != paVar9) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity * 4 + 4
                           );
          }
          uVar4 = Identifier::roundedRbpOffset(this_00);
          local_68._M_dataplus._M_p._0_1_ = 1;
          local_68._M_dataplus._M_p = local_68._M_dataplus._M_p & 0xffffffff;
          local_68._M_string_length._0_2_ = 0x52;
          local_68._M_string_length._2_1_ = 0;
          local_68._M_string_length._4_4_ = 0;
          sub_abi_cxx11_(&local_88,(Generator *)(ulong)uVar4,(int)&local_68,(Register *)0x0,in_R8D);
          pwVar6 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                             (stream,local_88._M_dataplus._M_p,local_88._M_string_length);
          plVar2 = *(long **)(pwVar6 + *(long *)(*(long *)pwVar6 + -0x18) + 0xf0);
          if (plVar2 == (long *)0x0) {
            std::__throw_bad_cast();
          }
          (**(code **)(*plVar2 + 0x50))(plVar2,10);
          std::wostream::put((wchar_t)pwVar6);
          std::wostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_88._M_dataplus._M_p != paVar1) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity * 4 + 4
                           );
          }
          local_68._M_dataplus._M_p = (pointer)paVar9;
          std::__cxx11::wstring::_M_construct<wchar_t_const*>
                    ((wstring *)&local_68,L"Arguments copy from registers to variables",L"");
          comment(&local_88,&local_68);
          pwVar6 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                             (stream,local_88._M_dataplus._M_p,local_88._M_string_length);
          plVar2 = *(long **)(pwVar6 + *(long *)(*(long *)pwVar6 + -0x18) + 0xf0);
          if (plVar2 == (long *)0x0) {
            std::__throw_bad_cast();
          }
          (**(code **)(*plVar2 + 0x50))(plVar2,10);
          std::wostream::put((wchar_t)pwVar6);
          std::wostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_88._M_dataplus._M_p != paVar1) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity * 4 + 4
                           );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_68._M_dataplus._M_p != paVar9) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity * 4 + 4
                           );
          }
          pIVar7 = (this_00->functionArgs).
                   super__Vector_base<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((this_00->functionArgs).
              super__Vector_base<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>
              ._M_impl.super__Vector_impl_data._M_finish != pIVar7) {
            lVar10 = 0x78;
            uVar8 = 0;
            do {
              if (*(int *)((long)pIVar7 + lVar10 + -0x38) == 1) {
                local_68._M_dataplus._M_p._0_1_ = 1;
                local_68._M_dataplus._M_p._4_4_ = 1;
                local_68._M_string_length._0_2_ = (undefined2)uVar8;
                local_68._M_string_length._2_1_ = 0;
                local_68._M_string_length._4_4_ = 0;
                local_48.ptrOffset = *(int *)((long)&(pIVar7->name)._M_dataplus._M_p + lVar10);
                local_48.integer = true;
                local_48.size = Full;
                local_48.argumentIndex = 0x51;
                local_48.isPtr = true;
                mov_abi_cxx11_(&local_88,(Generator *)&local_68,&local_48,(Register *)0x6c,in_R8D);
                pwVar6 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                   (stream,local_88._M_dataplus._M_p,local_88._M_string_length);
                plVar2 = *(long **)(pwVar6 + *(long *)(*(long *)pwVar6 + -0x18) + 0xf0);
                if (plVar2 == (long *)0x0) {
                  std::__throw_bad_cast();
                }
                (**(code **)(*plVar2 + 0x50))(plVar2,10);
                std::wostream::put((wchar_t)pwVar6);
                std::wostream::flush();
                if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                     *)local_88._M_dataplus._M_p != &local_88.field_2) {
                  operator_delete(local_88._M_dataplus._M_p,
                                  local_88.field_2._M_allocated_capacity * 4 + 4);
                }
              }
              uVar8 = uVar8 + 1;
              pIVar7 = (this_00->functionArgs).
                       super__Vector_base<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              lVar10 = lVar10 + 0xa0;
            } while (uVar8 < (ulong)(((long)(this_00->functionArgs).
                                            super__Vector_base<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pIVar7 >> 5) * -0x3333333333333333));
          }
        }
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::wstring::_M_construct<wchar_t_const*>
                  ((wstring *)&local_68,L"Function body",L"");
        comment(&local_88,&local_68);
        paVar9 = &local_88.field_2;
        pwVar6 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                           (stream,local_88._M_dataplus._M_p,local_88._M_string_length);
        plVar2 = *(long **)(pwVar6 + *(long *)(*(long *)pwVar6 + -0x18) + 0xf0);
        if (plVar2 == (long *)0x0) {
          std::__throw_bad_cast();
        }
        (**(code **)(*plVar2 + 0x50))(plVar2,10);
        std::wostream::put((wchar_t)pwVar6);
        std::wostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_88._M_dataplus._M_p != paVar9) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity * 4 + 4);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity * 4 + 4);
        }
        writeFunctionBody(local_38,stream,(long)this_00->tokenIndex);
        local_68._M_dataplus._M_p._0_1_ = 1;
        local_68._M_dataplus._M_p = local_68._M_dataplus._M_p & 0xffffffff;
        local_68._M_string_length._0_2_ = 0x51;
        local_68._M_string_length._2_1_ = 0;
        local_68._M_string_length._4_4_ = 0;
        local_48.integer = true;
        local_48.size = Full;
        local_48.argumentIndex = 0x52;
        local_48.isPtr = false;
        local_48.ptrOffset = 0;
        in_RCX = 0;
        mov_abi_cxx11_(&local_88,(Generator *)&local_68,&local_48,(Register *)0x0,in_R8D);
        pwVar6 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                           (stream,local_88._M_dataplus._M_p,local_88._M_string_length);
        plVar2 = *(long **)(pwVar6 + *(long *)(*(long *)pwVar6 + -0x18) + 0xf0);
        if (plVar2 == (long *)0x0) {
          std::__throw_bad_cast();
        }
        (**(code **)(*plVar2 + 0x50))(plVar2,10);
        std::wostream::put((wchar_t)pwVar6);
        std::wostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_88._M_dataplus._M_p != paVar9) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity * 4 + 4);
        }
        local_68._M_dataplus._M_p._0_1_ = 1;
        local_68._M_dataplus._M_p = local_68._M_dataplus._M_p & 0xffffffff;
        local_68._M_string_length._0_2_ = 0x51;
        local_68._M_string_length._2_1_ = 0;
        local_68._M_string_length._4_4_ = 0;
        pop_abi_cxx11_(&local_88,(Generator *)&local_68,(Register *)0x0,(wchar_t)in_RCX);
        pwVar6 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                           (stream,local_88._M_dataplus._M_p,local_88._M_string_length);
        plVar2 = *(long **)(pwVar6 + *(long *)(*(long *)pwVar6 + -0x18) + 0xf0);
        if (plVar2 == (long *)0x0) {
          std::__throw_bad_cast();
        }
        (**(code **)(*plVar2 + 0x50))(plVar2,10);
        std::wostream::put((wchar_t)pwVar6);
        std::wostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_88._M_dataplus._M_p != paVar9) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity * 4 + 4);
        }
        local_88._M_dataplus._M_p = (pointer)paVar9;
        wmemcpy(paVar9->_M_local_buf,L"ret",3);
        _Var3._M_p = local_88._M_dataplus._M_p;
        local_88._M_string_length = 3;
        local_88._M_dataplus._M_p[3] = L'\0';
        pwVar6 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(stream,_Var3._M_p,3);
        plVar2 = *(long **)(pwVar6 + *(long *)(*(long *)pwVar6 + -0x18) + 0xf0);
        if (plVar2 == (long *)0x0) {
          std::__throw_bad_cast();
        }
        (**(code **)(*plVar2 + 0x50))(plVar2,10);
        std::wostream::put((wchar_t)pwVar6);
        std::wostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_88._M_dataplus._M_p != paVar9) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity * 4 + 4);
        }
      }
      this_00 = this_00 + 1;
      pvVar5 = Tokenizer::identifiers(local_38->m_tokenizer);
    } while (this_00 !=
             (pvVar5->
             super__Vector_base<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void Generator::writeFunctions(std::wostream &stream)
{
    for(std::vector<Identifier>::const_iterator identifierIterator = m_tokenizer.identifiers().begin(); identifierIterator != m_tokenizer.identifiers().end(); ++identifierIterator)
    {
        const Identifier &identifier = *identifierIterator;

        if (identifier.type == Identifier::Type::Function)
        {
            stream << comment(L"Function begin") << std::endl;
            stream << hash(identifier.decoratedName) << L':' << std::endl;
            stream << push(Register(Register::StackBase, Register::Size::Full)) << std::endl;
            stream << mov(Register(Register::StackTop, Register::Size::Full), Register(Register::StackBase, Register::Size::Full)) << std::endl;
            if (identifier.rbpOffset > 0)
            {
                stream << comment(L"Space allocate for variables") << std::endl;
                stream << sub( identifier.roundedRbpOffset() , Register(Register::StackTop, Register::Size::Full)) << std::endl;
                stream << comment(L"Arguments copy from registers to variables") << std::endl;
                // copying arguments
                for(size_t i = 0 ; i < identifier.functionArgs.size(); ++i)
                {
                    if (identifier.functionArgs[i].type == Identifier::Type::Integer)
                    {
                        stream << mov(Register(i, Register::Size::Half), Register(Register::StackBase, Register::Size::Full, identifier.functionArgs[i].rbpOffset), L'l') << std::endl;
                    }
                }
            }
            stream << comment(L"Function body") << std::endl;
            writeFunctionBody(stream, static_cast<size_t>(identifier.tokenIndex));
            // function end
            stream << mov(Register(Register::StackBase, Register::Size::Full), Register(Register::StackTop, Register::Size::Full)) << std::endl;
            stream << pop(Register(Register::StackBase, Register::Size::Full)) << std::endl;
            stream << ret() << std::endl;
        }
    }
}